

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reentrant.h
# Opt level: O2

int mutex_init(pthread_mutex_t *m,pthread_mutexattr_t *a)

{
  int iVar1;
  pthread_mutexattr_t attr;
  
  pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,3);
  pthread_mutex_init((pthread_mutex_t *)m,(pthread_mutexattr_t *)&attr);
  iVar1 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
  return iVar1;
}

Assistant:

static inline int
mutex_init(pthread_mutex_t *m, const pthread_mutexattr_t *a
			     __attribute__ ((unused)))
{
	pthread_mutexattr_t attr;
	int rslt;

	pthread_mutexattr_init(&attr);
#if defined(__linux__)
	pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ADAPTIVE_NP);
#endif
	rslt = pthread_mutex_init(m, &attr);
	pthread_mutexattr_destroy(&attr);

	return (rslt);
}